

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.h
# Opt level: O3

string * google::protobuf::util::converter::ValueAsString<int>
                   (string *__return_storage_ptr__,int value)

{
  char *pcVar1;
  char local_38 [32];
  
  pcVar1 = FastInt32ToBufferLeft(value,local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,local_38,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ValueAsString(T value) {
  return StrCat(value);
}